

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void __thiscall
QSslSocket::setLocalCertificate(QSslSocket *this,QString *path,EncodingFormat format)

{
  char cVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_58;
  QSslCertificate local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_38,(QString *)path);
  cVar1 = QFile::open((QFile *)&local_38,0x11);
  if (cVar1 != '\0') {
    QIODevice::readAll();
    QSslCertificate::QSslCertificate(&local_40,(QByteArray *)&QStack_58,format);
    setLocalCertificate(this,&local_40);
    QSslCertificate::~QSslCertificate(&local_40);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_58);
  }
  QFile::~QFile((QFile *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocket::setLocalCertificate(const QString &path,
                                     QSsl::EncodingFormat format)
{
    QFile file(path);
    if (file.open(QIODevice::ReadOnly | QIODevice::Text))
        setLocalCertificate(QSslCertificate(file.readAll(), format));

}